

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O1

void cdns_readcb(int fd,short what,void *_arg)

{
  uint *puVar1;
  server_info *svr;
  bool bVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  uint16_t uVar5;
  uint uVar6;
  int iVar7;
  ulong len;
  short *psVar8;
  void *pvVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  int priority;
  long lVar13;
  timeval rtt;
  timeval tv;
  char ip_str [55];
  char buf [4096];
  
  svr = *_arg;
  if ((what & 1U) != 0) {
    if (*(short *)((long)_arg + 8) != 3) {
      update_server_rtt(svr,(uint)*(ushort *)((long)_arg + 0xe) * 1000);
    }
    goto LAB_0010739c;
  }
  len = recvfrom(fd,buf,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0);
  if (len == 0xffffffffffffffff) goto LAB_0010739c;
  fmt_sockaddr_port((sockaddr *)(*_arg + 0x10),ip_str,0x37);
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  _Var4 = tv.tv_usec;
  _Var3 = tv.tv_sec;
  rtt.tv_sec = tv.tv_sec - *(long *)((long)_arg + 0xa8);
  rtt.tv_usec = tv.tv_usec - *(long *)((long)_arg + 0xb0);
  if (rtt.tv_usec < 0) {
    rtt.tv_sec = rtt.tv_sec + -1;
    rtt.tv_usec = rtt.tv_usec + 1000000;
  }
  lVar13 = rtt.tv_usec / 1000 + rtt.tv_sec * 1000;
  if (((ulong)svr->hijack_threshold == 0) || ((long)(ulong)svr->hijack_threshold < lVar13)) {
    if ((len < 0xd) || (*(short *)((long)_arg + 0xc) != buf._0_2_)) {
      pcVar10 = "Bad response";
      iVar7 = 0x11a;
      priority = 6;
LAB_001071b9:
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",iVar7
                 ,"verify_response",0,priority,pcVar10);
      goto LAB_001071c0;
    }
    uVar11 = 0;
    bVar2 = true;
    if ((*(byte *)(*_arg + 0x90) & 1) != 0) {
      uVar5 = dns_get_edns_udp_payload_size(buf,len);
      if (uVar5 == 0) {
        bVar2 = false;
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x127,"verify_response",0,7,"Bad response");
        psVar8 = (short *)dns_get_answered_ip(buf,len);
        uVar11 = 0xffffffff;
        if (psVar8 != (short *)0x0) {
          if (*psVar8 == 0x400) {
            blacklist_add_v4((ipv4_key *)(psVar8 + 1));
            bVar2 = false;
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0xe8,"add_to_blacklist",0,7,"Add to blacklist: %x %hhu.%hhu.%hhu.%hhu",4,
                       (ulong)(uint)(int)(char)psVar8[1],
                       (ulong)(uint)(int)*(char *)((long)psVar8 + 3),
                       (ulong)(uint)(int)(char)psVar8[2],
                       (ulong)(uint)(int)*(char *)((long)psVar8 + 5));
            uVar11 = 0xffffffff;
          }
          else {
            bVar2 = false;
          }
        }
      }
      else {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x123,"verify_response",0,7,"Possible good response (+edns)");
        uVar11 = 1;
      }
    }
    uVar12 = 0xffffffff;
    uVar6 = 0xffffffff;
    if ((bVar2) &&
       ((((1 < (ushort)(buf._6_2_ << 8 | (ushort)buf._6_2_ >> 8) || (buf._8_2_ != 0)) ||
         (buf._10_2_ != 0)) || (uVar6 = uVar11, (buf[3] & 0xfU) != 0)))) {
      uVar6 = 1;
    }
    if (-1 < (int)uVar6) {
      psVar8 = (short *)dns_get_answered_ip(buf,len);
      if (((psVar8 == (short *)0x0) || (*psVar8 != 0x400)) ||
         (pvVar9 = blacklist_find_v4((ipv4_key *)(psVar8 + 1)), pvVar9 == (void *)0x0)) {
        uVar12 = (ulong)uVar6;
      }
      else {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0xf4,"is_ip_in_blacklist",0,7,"Found in blacklist: %x %hhu.%hhu.%hhu.%hhu",4,
                   (ulong)(uint)(int)(char)psVar8[1],(ulong)(uint)(int)*(char *)((long)psVar8 + 3),
                   (ulong)(uint)(int)(char)psVar8[2],(ulong)(uint)(int)*(char *)((long)psVar8 + 5));
        pcVar10 = dns_get_answered_cnname(buf,len);
        uVar12 = (ulong)(-(uint)(pcVar10 == (char *)0x0) | uVar6);
      }
    }
    if ((int)uVar12 < 0) {
      uVar12 = 0xffffffff;
    }
    else if (((*(byte *)(*_arg + 0x90) & 2) != 0) && (buf._8_2_ == 0)) {
      pcVar10 = "Lack of authority records";
      iVar7 = 0x144;
      priority = 7;
      goto LAB_001071b9;
    }
  }
  else {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x175,
               "cdns_readcb",0,7,"Response received from %s too fast!",ip_str);
LAB_001071c0:
    uVar12 = 0xffffffff;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x17c,
             "cdns_readcb",0,7,
             "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",ip_str,
             (ulong)*(ushort *)((long)_arg + 0xc),len,lVar13,(ulong)(uint)(svr->stats).avg_rtt,
             uVar12);
  if ((int)uVar12 < 0) {
    rtt.tv_sec = _Var3 - *(long *)((long)_arg + 0x98);
    rtt.tv_usec = _Var4 - *(long *)((long)_arg + 0xa0);
    if (rtt.tv_usec < 0) {
      rtt.tv_sec = rtt.tv_sec + -1;
      rtt.tv_usec = rtt.tv_usec + 1000000;
    }
    tv.tv_sec = (__time_t)*(ushort *)((long)_arg + 0xe);
    tv.tv_usec = 0;
    rtt.tv_sec = tv.tv_sec - rtt.tv_sec;
    lVar13 = -rtt.tv_usec;
    if (0 < rtt.tv_usec) {
      rtt.tv_sec = rtt.tv_sec + -1;
      lVar13 = 1000000 - rtt.tv_usec;
    }
    rtt.tv_usec = lVar13;
    iVar7 = event_add(*(undefined8 *)((long)_arg + 0x90),&rtt);
    if (iVar7 == 0) {
      return;
    }
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x1a5,
               "cdns_readcb",1,3,"event_add");
  }
  else {
    if (((int)uVar12 == 0) && (*(short *)((long)_arg + 8) == 1)) {
      *(undefined2 *)((long)_arg + 8) = 2;
    }
    iVar7 = event_get_fd(listener);
    uVar12 = sendto(iVar7,buf,len,0,(sockaddr *)((long)_arg + 0x10),0x80);
    if (uVar12 == 0xffffffffffffffff) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x18e
                 ,"cdns_readcb",1,7,"sendto: Can\'t forward packet");
    }
    else if (uVar12 == len) {
      update_server_rtt(svr,(int)lVar13);
      puVar1 = &(svr->stats).n_rsp;
      *puVar1 = *puVar1 + 1;
    }
    else {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x191
                 ,"cdns_readcb",0,7,"sendto: I was sending %zd bytes, but only %zd were sent.",len,
                 uVar12);
    }
    *(undefined2 *)((long)_arg + 8) = 3;
  }
LAB_0010739c:
  cdns_drop_request((dns_request *)_arg);
  return;
}

Assistant:

static void cdns_readcb(int fd, short what, void *_arg)
{
    dns_request * req = _arg;
    struct server_info * svr = req->server;
    struct timeval tv, rtt;
    char   buf[DEFAULT_BUFFER_SIZE];
    char   ip_str[INET_ADDR_PORT_STRLEN];
    size_t pktlen;
    int    rc;

    if (what & EV_TIMEOUT) {
        if (req->state != STATE_RESPONSE_SENT) {
            update_server_rtt(svr, req->timeout * 1000);
        }
        goto finish;
    }

    pktlen = recvfrom(fd, &buf[0], sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    // Calculate round trip time
    gettimeofday(&tv, 0);
    timersub(&tv, &req->req_fwd_time, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;
    
    if (svr->hijack_threshold > 0 && rtt_ms <= svr->hijack_threshold) {
        log_error(LOG_DEBUG, "Response received from %s too fast!", &ip_str[0]);
        rc = -1;
    }
    else {
        rc = verify_response(req, &buf[0], pktlen);
    }
    log_error(LOG_DEBUG, "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",
              &ip_str[0], req->id, pktlen, rtt_ms, svr->stats.avg_rtt, rc);
    if (rc < 0)
        goto continue_waiting;
    if (rc > 0)
        goto accept;

    // TODO: can not determined?
    if (req->state == STATE_REQUEST_SENT) {
        req->state = STATE_RECV_1ST_RSP;
    }

accept:
    {
        int sender = event_get_fd(listener);
        ssize_t outgoing = sendto(sender, buf, pktlen, 0,
                                  (const struct sockaddr *)&req->client_addr,
                                  sizeof(req->client_addr));
        if (outgoing == -1) {
            log_errno(LOG_DEBUG, "sendto: Can't forward packet");
        }
        else if (outgoing != pktlen) {
            log_error(LOG_DEBUG, "sendto: I was sending %zd bytes, but only %zd were sent.", pktlen, outgoing);
        }
        else {
            update_server_rtt(svr, rtt_ms);
            svr->stats.n_rsp += 1;
        }
        req->state = STATE_RESPONSE_SENT;
    }
finish:
    cdns_drop_request(req);
    return;

continue_waiting:
    timersub(&tv, &req->req_recv_time, &rtt);
    tv.tv_sec = req->timeout;
    tv.tv_usec = 0;
    timersub(&tv, &rtt, &rtt);
    // update with time left for timeout
    int error = event_add(req->resolver, &rtt);
    if (error) {
        log_errno(LOG_ERR, "event_add");
        cdns_drop_request(req);
    }
    return;

}